

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

bool IsApplyArgs(ParseNodeCall *callNode)

{
  OpCode OVar1;
  ParseNode *pPVar2;
  ParseNode *pPVar3;
  IdentPtr pnode;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  PropertyId PVar7;
  ParseNodeName *pPVar8;
  ParseNodeBin *pPVar9;
  
  pPVar2 = callNode->pnodeTarget;
  if ((pPVar2 != (ParseNode *)0x0) && (pPVar2->nop == knopDot)) {
    pPVar3 = callNode->pnodeArgs;
    pPVar8 = (ParseNodeName *)ParseNode::AsParseNodeBin(pPVar2);
    pnode = pPVar8->pid;
    bVar5 = true;
    if (pnode != (IdentPtr)0x0) {
      OVar1 = *(OpCode *)&pnode->m_pidNext;
      pPVar8 = (ParseNodeName *)(ulong)OVar1;
      if ((OVar1 == knopDot) || (OVar1 == knopName)) {
        bVar4 = IsArguments((ParseNode *)pnode);
        pPVar8 = (ParseNodeName *)(ulong)bVar4;
        if (!bVar4) {
          pPVar8 = (ParseNodeName *)ParseNode::AsParseNodeBin(pPVar2);
          if ((ParseNode *)pPVar8->symRef != (ParseNode *)0x0) {
            pPVar8 = ParseNode::AsParseNodeName((ParseNode *)pPVar8->symRef);
            PVar7 = ParseNodeName::PropertyIdFromNameNode(pPVar8);
            pPVar8 = (ParseNodeName *)(ulong)(PVar7 == 0x4e);
            if ((pPVar3 != (ParseNode *)0x0 && PVar7 == 0x4e) && (pPVar3->nop == knopList)) {
              pPVar9 = ParseNode::AsParseNodeBin(pPVar3);
              pPVar2 = pPVar9->pnode1;
              pPVar8 = (ParseNodeName *)ParseNode::AsParseNodeBin(pPVar3);
              if (pPVar2 != (ParseNode *)0x0) {
                pPVar3 = (ParseNode *)pPVar8->symRef;
                bVar4 = ByteCodeGenerator::IsThis(pPVar2);
                pPVar8 = (ParseNodeName *)(ulong)bVar4;
                if ((pPVar3 != (ParseNode *)0x0 && bVar4) && (pPVar3->nop == knopName)) {
                  pPVar8 = ParseNode::AsParseNodeName(pPVar3);
                  if (pPVar8->sym != (Symbol *)0x0) {
                    pPVar8 = ParseNode::AsParseNodeName(pPVar3);
                    bVar5 = Symbol::IsArguments(pPVar8->sym);
                    pPVar8 = (ParseNodeName *)(ulong)bVar5;
                    bVar5 = false;
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar6 = (byte)pPVar8;
    if (!bVar5) goto LAB_008196d1;
  }
  bVar6 = 0;
LAB_008196d1:
  return (bool)(bVar6 & 1);
}

Assistant:

bool IsApplyArgs(ParseNodeCall* callNode)
{
    ParseNode* target = callNode->pnodeTarget;
    ParseNode* args = callNode->pnodeArgs;
    if ((target != nullptr) && (target->nop == knopDot))
    {
        ParseNode* lhsNode = target->AsParseNodeBin()->pnode1;
        if ((lhsNode != nullptr) && ((lhsNode->nop == knopDot) || (lhsNode->nop == knopName)) && !IsArguments(lhsNode))
        {
            ParseNode* nameNode = target->AsParseNodeBin()->pnode2;
            if (nameNode != nullptr)
            {
                bool nameIsApply = nameNode->AsParseNodeName()->PropertyIdFromNameNode() == Js::PropertyIds::apply;
                if (nameIsApply && args != nullptr && args->nop == knopList)
                {
                    ParseNode* arg1 = args->AsParseNodeBin()->pnode1;
                    ParseNode* arg2 = args->AsParseNodeBin()->pnode2;
                    if ((arg1 != nullptr) && ByteCodeGenerator::IsThis(arg1) && (arg2 != nullptr) && (arg2->nop == knopName) && (arg2->AsParseNodeName()->sym != nullptr))
                    {
                        return arg2->AsParseNodeName()->sym->IsArguments();
                    }
                }
            }
        }
    }
    return false;
}